

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall
xatlas::internal::pack::Atlas::addCharts(Atlas *this,TaskScheduler *taskScheduler,Atlas *paramAtlas)

{
  Chart *pCVar1;
  Task task_00;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  ChartGroup *this_00;
  AddChartTaskArgs *pAVar5;
  Chart *pCVar6;
  Chart **ppCVar7;
  uint32_t local_bc;
  uint32_t i_2;
  Task task;
  AddChartTaskArgs *args;
  uint32_t j;
  uint32_t count;
  ChartGroup *chartGroup_1;
  uint32_t i_1;
  ThreadLocal<xatlas::internal::BoundingBox2D> boundingBox;
  TaskGroupHandle local_60;
  uint32_t chartIndex;
  TaskGroupHandle taskGroup;
  undefined1 local_50 [8];
  Array<xatlas::internal::pack::AddChartTaskArgs> taskArgs;
  ChartGroup *chartGroup;
  uint32_t i;
  uint32_t chartGroupsCount;
  uint32_t chartCount;
  Atlas *paramAtlas_local;
  TaskScheduler *taskScheduler_local;
  Atlas *this_local;
  
  i = 0;
  uVar3 = param::Atlas::chartGroupCount(paramAtlas);
  for (chartGroup._4_4_ = 0; chartGroup._4_4_ < uVar3; chartGroup._4_4_ = chartGroup._4_4_ + 1) {
    taskArgs.m_base._16_8_ = param::Atlas::chartGroupAt(paramAtlas,chartGroup._4_4_);
    bVar2 = param::ChartGroup::isVertexMap((ChartGroup *)taskArgs.m_base._16_8_);
    if (!bVar2) {
      uVar4 = param::ChartGroup::chartCount((ChartGroup *)taskArgs.m_base._16_8_);
      i = uVar4 + i;
    }
  }
  if (i != 0) {
    Array<xatlas::internal::pack::AddChartTaskArgs>::Array
              ((Array<xatlas::internal::pack::AddChartTaskArgs> *)local_50,0);
    Array<xatlas::internal::pack::AddChartTaskArgs>::resize
              ((Array<xatlas::internal::pack::AddChartTaskArgs> *)local_50,i);
    local_60 = TaskScheduler::createTaskGroup(taskScheduler,i);
    boundingBox.m_array._4_4_ = 0;
    ThreadLocal<xatlas::internal::BoundingBox2D>::ThreadLocal
              ((ThreadLocal<xatlas::internal::BoundingBox2D> *)&stack0xffffffffffffff90);
    for (chartGroup_1._4_4_ = 0; chartGroup_1._4_4_ < uVar3;
        chartGroup_1._4_4_ = chartGroup_1._4_4_ + 1) {
      this_00 = param::Atlas::chartGroupAt(paramAtlas,chartGroup_1._4_4_);
      bVar2 = param::ChartGroup::isVertexMap(this_00);
      if (!bVar2) {
        uVar4 = param::ChartGroup::chartCount(this_00);
        for (args._0_4_ = 0; (uint)args < uVar4; args._0_4_ = (uint)args + 1) {
          pAVar5 = Array<xatlas::internal::pack::AddChartTaskArgs>::operator[]
                             ((Array<xatlas::internal::pack::AddChartTaskArgs> *)local_50,
                              boundingBox.m_array._4_4_);
          pAVar5->boundingBox =
               (ThreadLocal<xatlas::internal::BoundingBox2D> *)&stack0xffffffffffffff90;
          pCVar6 = param::ChartGroup::chartAt(this_00,(uint)args);
          pAVar5->paramChart = pCVar6;
          pAVar5 = Array<xatlas::internal::pack::AddChartTaskArgs>::operator[]
                             ((Array<xatlas::internal::pack::AddChartTaskArgs> *)local_50,
                              boundingBox.m_array._4_4_);
          task_00.userData = pAVar5;
          task_00.func = runAddChartTask;
          TaskScheduler::run(taskScheduler,local_60,task_00);
          boundingBox.m_array._4_4_ = boundingBox.m_array._4_4_ + 1;
        }
      }
    }
    TaskScheduler::wait(taskScheduler,&local_60);
    Array<xatlas::internal::pack::Chart_*>::resize(&this->m_charts,i);
    for (local_bc = 0; local_bc < i; local_bc = local_bc + 1) {
      pAVar5 = Array<xatlas::internal::pack::AddChartTaskArgs>::operator[]
                         ((Array<xatlas::internal::pack::AddChartTaskArgs> *)local_50,local_bc);
      pCVar1 = pAVar5->chart;
      ppCVar7 = Array<xatlas::internal::pack::Chart_*>::operator[](&this->m_charts,local_bc);
      *ppCVar7 = pCVar1;
    }
    ThreadLocal<xatlas::internal::BoundingBox2D>::~ThreadLocal
              ((ThreadLocal<xatlas::internal::BoundingBox2D> *)&stack0xffffffffffffff90);
    Array<xatlas::internal::pack::AddChartTaskArgs>::~Array
              ((Array<xatlas::internal::pack::AddChartTaskArgs> *)local_50);
  }
  return;
}

Assistant:

void addCharts(TaskScheduler *taskScheduler, param::Atlas *paramAtlas)
	{
		// Count charts.
		uint32_t chartCount = 0;
		const uint32_t chartGroupsCount = paramAtlas->chartGroupCount();
		for (uint32_t i = 0; i < chartGroupsCount; i++) {
			const param::ChartGroup *chartGroup = paramAtlas->chartGroupAt(i);
			if (chartGroup->isVertexMap())
				continue;
			chartCount += chartGroup->chartCount();
		}
		if (chartCount == 0)
			return;
		// Run one task per chart.
		Array<AddChartTaskArgs> taskArgs;
		taskArgs.resize(chartCount);
		TaskGroupHandle taskGroup = taskScheduler->createTaskGroup(chartCount);
		uint32_t chartIndex = 0;
		ThreadLocal<BoundingBox2D> boundingBox;
		for (uint32_t i = 0; i < chartGroupsCount; i++) {
			const param::ChartGroup *chartGroup = paramAtlas->chartGroupAt(i);
			if (chartGroup->isVertexMap())
				continue;
			const uint32_t count = chartGroup->chartCount();
			for (uint32_t j = 0; j < count; j++) {
				AddChartTaskArgs &args = taskArgs[chartIndex];
				args.boundingBox = &boundingBox;
				args.paramChart = chartGroup->chartAt(j);
				Task task;
				task.userData = &taskArgs[chartIndex];
				task.func = runAddChartTask;
				taskScheduler->run(taskGroup, task);
				chartIndex++;
			}
		}
		taskScheduler->wait(&taskGroup);
		// Get task output.
		m_charts.resize(chartCount);
		for (uint32_t i = 0; i < chartCount; i++)
			m_charts[i] = taskArgs[i].chart;
	}